

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void sig_handler(int signum)

{
  TTTGame *this;
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  Player local_90;
  Player local_50;
  _Self local_20;
  _Self local_18;
  iterator iter;
  int signum_local;
  
  iter._M_node._4_4_ = signum;
  if ((signum != 2) && (signum != 0xf)) {
    printf("Unrecognized signal captured: %d",(ulong)(uint)signum);
    return;
  }
  close(server_sock);
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<TTTGame_*,_std::allocator<TTTGame_*>_>::begin(&game_list_abi_cxx11_);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<TTTGame_*,_std::allocator<TTTGame_*>_>::end(&game_list_abi_cxx11_);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar3 = std::_List_iterator<TTTGame_*>::operator*(&local_18);
    TTTGame::GetPlayer1(&local_50,*ppTVar3);
    iVar2 = Player::GetSocket(&local_50);
    close(iVar2);
    Player::~Player(&local_50);
    ppTVar3 = std::_List_iterator<TTTGame_*>::operator*(&local_18);
    TTTGame::GetPlayer2(&local_90,*ppTVar3);
    iVar2 = Player::GetSocket(&local_90);
    close(iVar2);
    Player::~Player(&local_90);
    ppTVar3 = std::_List_iterator<TTTGame_*>::operator*(&local_18);
    this = *ppTVar3;
    if (this != (TTTGame *)0x0) {
      TTTGame::~TTTGame(this);
      operator_delete(this);
    }
    std::_List_iterator<TTTGame_*>::operator++(&local_18);
  }
  std::__cxx11::list<TTTGame_*,_std::allocator<TTTGame_*>_>::clear(&game_list_abi_cxx11_);
  printf("Exiting server\n");
  exit(0);
}

Assistant:

void sig_handler(int signum)
{
    switch(signum)
    {
        case SIGTERM:
        case SIGINT:
            close(server_sock);

            // Dynamically delete every game in the list and close every connected client
            for(auto iter = game_list.begin(); iter != game_list.end(); ++iter)
            {
                close((*iter)->GetPlayer1().GetSocket());
                close((*iter)->GetPlayer2().GetSocket());

                // Remove the game
                delete *iter;
            }

            game_list.clear();

            printf("Exiting server\n");
            exit(0);
            break;
        default: printf("Unrecognized signal captured: %d", signum);
    }
}